

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DefaultClockingReferenceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultClockingReferenceSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  size_t sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  Info *pIVar6;
  SyntaxNode *pSVar7;
  undefined4 uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  TokenKind TVar21;
  undefined1 uVar22;
  NumericTokenFlags NVar23;
  uint32_t uVar24;
  DefaultClockingReferenceSyntax *pDVar25;
  long lVar26;
  
  pDVar25 = (DefaultClockingReferenceSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultClockingReferenceSyntax *)this->endPtr < pDVar25 + 1) {
    pDVar25 = (DefaultClockingReferenceSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pDVar25 + 1);
  }
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar17 = args_3->kind;
  uVar18 = args_3->field_0x2;
  NVar19.raw = (args_3->numFlags).raw;
  uVar20 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar21 = args_4->kind;
  uVar22 = args_4->field_0x2;
  NVar23.raw = (args_4->numFlags).raw;
  uVar24 = args_4->rawLen;
  pIVar6 = args_4->info;
  (pDVar25->super_MemberSyntax).super_SyntaxNode.kind = DefaultClockingReference;
  (pDVar25->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar25->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar8 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar7 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pDVar25->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar25->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8
  ;
  (pDVar25->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar7;
  (pDVar25->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pDVar25->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (pDVar25->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pDVar25->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pDVar25->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pDVar25->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f85e0;
  (pDVar25->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pDVar25;
  sVar3 = (pDVar25->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar3 != 0) {
    ppAVar4 = (pDVar25->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar26 = 0;
    do {
      *(DefaultClockingReferenceSyntax **)(*(long *)((long)ppAVar4 + lVar26) + 8) = pDVar25;
      lVar26 = lVar26 + 8;
    } while (sVar3 << 3 != lVar26);
  }
  (pDVar25->defaultKeyword).kind = TVar9;
  (pDVar25->defaultKeyword).field_0x2 = uVar10;
  (pDVar25->defaultKeyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar25->defaultKeyword).rawLen = uVar12;
  (pDVar25->defaultKeyword).info = pIVar1;
  (pDVar25->clocking).kind = TVar13;
  (pDVar25->clocking).field_0x2 = uVar14;
  (pDVar25->clocking).numFlags = (NumericTokenFlags)NVar15.raw;
  (pDVar25->clocking).rawLen = uVar16;
  (pDVar25->clocking).info = pIVar2;
  (pDVar25->name).kind = TVar17;
  (pDVar25->name).field_0x2 = uVar18;
  (pDVar25->name).numFlags = (NumericTokenFlags)NVar19.raw;
  (pDVar25->name).rawLen = uVar20;
  (pDVar25->name).info = pIVar5;
  (pDVar25->semi).kind = TVar21;
  (pDVar25->semi).field_0x2 = uVar22;
  (pDVar25->semi).numFlags = (NumericTokenFlags)NVar23.raw;
  (pDVar25->semi).rawLen = uVar24;
  (pDVar25->semi).info = pIVar6;
  return pDVar25;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }